

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O0

void sglr::depthValueFloatClampCopy(PixelBufferAccess *dst,ConstPixelBufferAccess *src)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int stencil;
  TextureFormat *pTVar4;
  float fVar5;
  int local_3c;
  int local_38;
  int x_1;
  int y_1;
  int z_1;
  int x;
  int y;
  int z;
  int depth;
  int height;
  int width;
  ConstPixelBufferAccess *src_local;
  PixelBufferAccess *dst_local;
  
  iVar1 = tcu::ConstPixelBufferAccess::getWidth(&dst->super_ConstPixelBufferAccess);
  iVar2 = tcu::ConstPixelBufferAccess::getHeight(&dst->super_ConstPixelBufferAccess);
  iVar3 = tcu::ConstPixelBufferAccess::getDepth(&dst->super_ConstPixelBufferAccess);
  pTVar4 = tcu::ConstPixelBufferAccess::getFormat(src);
  if ((pTVar4->order == DS) &&
     (pTVar4 = tcu::ConstPixelBufferAccess::getFormat(&dst->super_ConstPixelBufferAccess),
     pTVar4->order == DS)) {
    for (x = 0; x < iVar3; x = x + 1) {
      for (z_1 = 0; z_1 < iVar2; z_1 = z_1 + 1) {
        for (y_1 = 0; y_1 < iVar1; y_1 = y_1 + 1) {
          fVar5 = tcu::ConstPixelBufferAccess::getPixDepth(src,y_1,z_1,x);
          fVar5 = de::clamp<float>(fVar5,0.0,1.0);
          tcu::PixelBufferAccess::setPixDepth(dst,fVar5,y_1,z_1,x);
          stencil = tcu::ConstPixelBufferAccess::getPixStencil(src,y_1,z_1,x);
          tcu::PixelBufferAccess::setPixStencil(dst,stencil,y_1,z_1,x);
        }
      }
    }
  }
  else {
    for (x_1 = 0; x_1 < iVar3; x_1 = x_1 + 1) {
      for (local_38 = 0; local_38 < iVar2; local_38 = local_38 + 1) {
        for (local_3c = 0; local_3c < iVar1; local_3c = local_3c + 1) {
          fVar5 = tcu::ConstPixelBufferAccess::getPixDepth(src,local_3c,local_38,x_1);
          fVar5 = de::clamp<float>(fVar5,0.0,1.0);
          tcu::PixelBufferAccess::setPixDepth(dst,fVar5,local_3c,local_38,x_1);
        }
      }
    }
  }
  return;
}

Assistant:

static void depthValueFloatClampCopy (const PixelBufferAccess& dst, const ConstPixelBufferAccess& src)
{
	int width	= dst.getWidth();
	int height	= dst.getHeight();
	int depth	= dst.getDepth();

	DE_ASSERT(src.getWidth() == width && src.getHeight() == height && src.getDepth() == depth);

	// clamping copy

	if (src.getFormat().order == tcu::TextureFormat::DS && dst.getFormat().order == tcu::TextureFormat::DS)
	{
		// copy only depth and stencil
		for (int z = 0; z < depth; z++)
		for (int y = 0; y < height; y++)
		for (int x = 0; x < width; x++)
		{
			dst.setPixDepth(de::clamp(src.getPixDepth(x, y, z), 0.0f, 1.0f), x, y, z);
			dst.setPixStencil(src.getPixStencil(x, y, z), x, y, z);
		}
	}
	else
	{
		// copy only depth
		for (int z = 0; z < depth; z++)
		for (int y = 0; y < height; y++)
		for (int x = 0; x < width; x++)
			dst.setPixDepth(de::clamp(src.getPixDepth(x, y, z), 0.0f, 1.0f), x, y, z);
	}
}